

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,u32 iLabel)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  u32 uVar4;
  uint uVar5;
  u32 uVar6;
  void *pvVar7;
  ulong uVar8;
  u8 *puVar9;
  char *zLeft;
  uint uVar10;
  u32 uVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  uint local_f8;
  size_t local_f0;
  JsonParse local_d8;
  JsonParse v;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  cVar2 = *zPath;
  uVar4 = 0xfffffffd;
  if (cVar2 == '[') {
    if ((pParse->aBlob[iRoot] & 0xf) != 0xb) {
      uVar4 = 0xfffffffe;
      goto LAB_001a2c31;
    }
    uVar6 = jsonbPayloadSize(pParse,iRoot,&local_3c);
    uVar11 = 0;
    uVar8 = 1;
    while( true ) {
      uVar5 = (uint)uVar8;
      bVar14 = zPath[uVar8];
      if ((ulong)bVar14 - 0x3a < 0xfffffffffffffff6) break;
      uVar11 = (uVar11 * 10 + (int)(char)bVar14) - 0x30;
      uVar8 = (ulong)(uVar5 + 1);
    }
    if ((uVar5 < 2) || (bVar14 != 0x5d)) {
      uVar4 = 0xfffffffd;
      if (zPath[1] != '#') goto LAB_001a2c31;
      uVar11 = jsonbArrayCount(pParse,iRoot);
      bVar14 = zPath[2];
      if (bVar14 != 0x2d) {
        uVar5 = 2;
LAB_001a2d4e:
        uVar4 = 0xfffffffd;
        if (bVar14 != 0x5d) goto LAB_001a2c31;
        goto LAB_001a2a21;
      }
      uVar8 = (ulong)(byte)zPath[3];
      uVar4 = 0xfffffffd;
      if (uVar8 - 0x3a < 0xfffffffffffffff6) goto LAB_001a2c31;
      uVar10 = 0;
      uVar13 = 3;
      do {
        uVar10 = (uVar10 * 10 + (int)(char)uVar8) - 0x30;
        uVar5 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar5;
        bVar14 = zPath[uVar13];
        uVar8 = (ulong)bVar14;
      } while (0xfffffffffffffff5 < uVar8 - 0x3a);
      bVar16 = uVar10 <= uVar11;
      uVar11 = uVar11 - uVar10;
      if (bVar16) goto LAB_001a2d4e;
    }
    else {
LAB_001a2a21:
      uVar10 = uVar6 + iRoot;
      uVar15 = local_3c + uVar10;
      for (; uVar4 = 0xffffffff, uVar10 < uVar15; uVar10 = uVar6 + uVar10 + local_3c) {
        bVar16 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar16) {
          uVar4 = jsonLookupStep(pParse,uVar10,zPath + (uVar5 + 1),0);
          iVar3 = pParse->delta;
          goto joined_r0x001a2d2a;
        }
        uVar6 = jsonbPayloadSize(pParse,uVar10,&local_3c);
        if (uVar6 == 0) goto LAB_001a2c31;
      }
      if (uVar15 < uVar10) goto LAB_001a2c31;
      if (uVar11 == 0) {
        uVar4 = 0xfffffffe;
        if (2 < pParse->eEdit) {
          v.aIns = &DAT_aaaaaaaaaaaaaaaa;
          v._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          v._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
          v._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          v._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          v.zJson = &DAT_aaaaaaaaaaaaaaaa;
          v.db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
          v.aBlob = &DAT_aaaaaaaaaaaaaaaa;
          v._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          uVar4 = jsonCreateEditSubstructure(pParse,&v,zPath + (uVar5 + 1));
          if (uVar4 < 0xfffffffd) {
            iVar3 = jsonBlobMakeEditable(pParse,v.nBlob);
            if (iVar3 != 0) {
              jsonBlobEdit(pParse,uVar10,0,v.aBlob,v.nBlob);
            }
          }
          jsonParseReset(&v);
          if (pParse->delta != 0) {
            jsonAfterEditSizeAdjust(pParse,iRoot);
          }
        }
        goto LAB_001a2c31;
      }
    }
    uVar4 = 0xfffffffe;
    goto LAB_001a2c31;
  }
  if (cVar2 != '.') {
    if (cVar2 == '\0') {
      if ((pParse->eEdit != '\0') && (iVar3 = jsonBlobMakeEditable(pParse,pParse->nIns), iVar3 != 0)
         ) {
        uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
        if (pParse->eEdit != '\x03') {
          uVar4 = uVar4 + local_3c;
          if (pParse->eEdit == '\x01') {
            iVar3 = iRoot - iLabel;
            uVar11 = iLabel;
            if (iLabel == 0) {
              iVar3 = 0;
              uVar11 = iRoot;
            }
            uVar4 = uVar4 + iVar3;
            puVar9 = (u8 *)0x0;
            uVar6 = 0;
            iRoot = uVar11;
          }
          else {
            puVar9 = pParse->aIns;
            uVar6 = pParse->nIns;
          }
          jsonBlobEdit(pParse,iRoot,uVar4,puVar9,uVar6);
        }
      }
      pParse->iLabel = iLabel;
      uVar4 = iRoot;
    }
    goto LAB_001a2c31;
  }
  puVar9 = pParse->aBlob;
  bVar14 = puVar9[iRoot];
  pcVar1 = zPath + 1;
  cVar2 = zPath[1];
  if (cVar2 == '\"') {
    uVar8 = 1;
    do {
      uVar5 = (uint)uVar8;
      cVar2 = pcVar1[uVar8];
      if (cVar2 == '\\') {
        if (pcVar1[uVar5 + 1] != '\0') {
          uVar5 = uVar5 + 1;
        }
      }
      else {
        if (cVar2 == '\0') goto LAB_001a2c31;
        if (cVar2 == '\"') goto LAB_001a2a80;
      }
      uVar8 = (ulong)(uVar5 + 1);
    } while( true );
  }
  local_f8 = 1;
  uVar8 = 0;
  while (((cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '['))) {
    uVar8 = (ulong)((int)uVar8 + 1);
    cVar2 = pcVar1[uVar8];
  }
  zLeft = pcVar1;
  local_f0 = uVar8;
  if ((int)uVar8 == 0) goto LAB_001a2c31;
  goto LAB_001a2aae;
LAB_001a2a80:
  uVar8 = (ulong)(uVar5 + 1);
  pvVar7 = memchr(zPath + 2,0x5c,(ulong)(uVar5 - 1));
  local_f8 = (uint)(pvVar7 == (void *)0x0);
  zLeft = zPath + 2;
  local_f0 = (ulong)(uVar5 - 1);
LAB_001a2aae:
  uVar4 = 0xfffffffe;
  if ((bVar14 & 0xf) == 0xc) {
    uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
    uVar10 = uVar4 + iRoot;
    uVar5 = local_3c + uVar10;
    while( true ) {
      uVar6 = (u32)local_f0;
      uVar4 = 0xffffffff;
      if (uVar5 <= uVar10) break;
      bVar14 = puVar9[uVar10] & 0xf;
      if ((byte)(bVar14 - 0xb) < 0xfc) goto LAB_001a2c31;
      uVar4 = jsonbPayloadSize(pParse,uVar10,&local_3c);
      if (uVar4 == 0) {
LAB_001a2f43:
        uVar4 = 0xffffffff;
        goto LAB_001a2c31;
      }
      uVar15 = local_3c + uVar4 + uVar10;
      if (uVar5 <= uVar15) goto LAB_001a2f43;
      iVar3 = jsonLabelCompare(zLeft,uVar6,local_f8,(char *)(puVar9 + (uVar4 + uVar10)),local_3c,
                               (uint)(bVar14 == 10 || bVar14 == 7));
      puVar9 = pParse->aBlob;
      if (iVar3 != 0) {
        if ((0xc < (puVar9[uVar15] & 0xf)) ||
           (uVar6 = jsonbPayloadSize(pParse,uVar15,&local_3c), uVar6 == 0)) goto LAB_001a2f43;
        uVar4 = 0xffffffff;
        if (uVar6 + uVar15 + local_3c <= uVar5) {
          uVar4 = jsonLookupStep(pParse,uVar15,pcVar1 + uVar8,uVar10);
          iVar3 = pParse->delta;
joined_r0x001a2d2a:
          if (iVar3 != 0) {
            jsonAfterEditSizeAdjust(pParse,iRoot);
          }
        }
        goto LAB_001a2c31;
      }
      if ((0xc < (puVar9[uVar15] & 0xf)) ||
         (uVar4 = jsonbPayloadSize(pParse,uVar15,&local_3c), uVar4 == 0)) goto LAB_001a2f43;
      uVar10 = uVar4 + uVar15 + local_3c;
    }
    if ((uVar10 <= uVar5) && (uVar4 = 0xfffffffe, 2 < pParse->eEdit)) {
      v.aIns = &DAT_aaaaaaaaaaaaaaaa;
      v._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      v._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
      v._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      v._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      v.zJson = &DAT_aaaaaaaaaaaaaaaa;
      v.db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
      v.aBlob = &DAT_aaaaaaaaaaaaaaaa;
      v._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8.bJsonIsRCStr = '\0';
      local_d8.hasNonstd = '\0';
      local_d8.bReadOnly = '\0';
      local_d8.eEdit = '\0';
      local_d8.delta = 0;
      local_d8.nIns = 0;
      local_d8.iLabel = 0;
      local_d8.nJson = 0;
      local_d8.nJPRef = 0;
      local_d8.iErr = 0;
      local_d8.iDepth = 0;
      local_d8.nErr = '\0';
      local_d8.oom = '\0';
      local_d8.aIns = (u8 *)0x0;
      local_d8.zJson = (char *)0x0;
      local_d8.aBlob = (u8 *)0x0;
      local_d8.nBlob = 0;
      local_d8.nBlobAlloc = 0;
      local_d8.db = pParse->db;
      jsonBlobAppendNode(&local_d8,'\n' - (local_f8 == 0),uVar6,(void *)0x0);
      pParse->oom = pParse->oom | local_d8.oom;
      uVar4 = jsonCreateEditSubstructure(pParse,&v,pcVar1 + uVar8);
      if (uVar4 < 0xfffffffd) {
        uVar11 = local_d8.nBlob;
        uVar8 = local_d8._8_8_ & 0xffffffff;
        iVar12 = local_d8.nBlob + uVar6;
        iVar3 = jsonBlobMakeEditable(pParse,v.nBlob + iVar12);
        if (iVar3 != 0) {
          jsonBlobEdit(pParse,uVar10,0,(u8 *)0x0,iVar12 + v.nBlob);
          if (pParse->oom == '\0') {
            memcpy(pParse->aBlob + uVar10,local_d8.aBlob,uVar8);
            memcpy(pParse->aBlob + (uVar10 + uVar11),zLeft,local_f0);
            memcpy(pParse->aBlob + (uVar10 + uVar11 + uVar6),v.aBlob,v._8_8_ & 0xffffffff);
            if (pParse->delta != 0) {
              jsonAfterEditSizeAdjust(pParse,iRoot);
            }
          }
        }
      }
      jsonParseReset(&v);
      jsonParseReset(&local_d8);
    }
  }
LAB_001a2c31:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

static u32 jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this element of aBlob[] */
  const char *zPath,      /* The path to search */
  u32 iLabel              /* Label if iRoot is a value of in an object */
){
  u32 i, j, k, nKey, sz, n, iEnd, rc;
  const char *zKey;
  u8 x;

  if( zPath[0]==0 ){
    if( pParse->eEdit && jsonBlobMakeEditable(pParse, pParse->nIns) ){
      n = jsonbPayloadSize(pParse, iRoot, &sz);
      sz += n;
      if( pParse->eEdit==JEDIT_DEL ){
        if( iLabel>0 ){
          sz += iRoot - iLabel;
          iRoot = iLabel;
        }
        jsonBlobEdit(pParse, iRoot, sz, 0, 0);
      }else if( pParse->eEdit==JEDIT_INS ){
        /* Already exists, so json_insert() is a no-op */
      }else{
        /* json_set() or json_replace() */
        jsonBlobEdit(pParse, iRoot, sz, pParse->aIns, pParse->nIns);
      }
    }
    pParse->iLabel = iLabel;
    return iRoot;
  }
  if( zPath[0]=='.' ){
    int rawKey = 1;
    x = pParse->aBlob[iRoot];
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){
        if( zPath[i]=='\\' && zPath[i+1]!=0 ) i++;
      }
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
      testcase( nKey==0 );
      rawKey = memchr(zKey, '\\', nKey)==0;
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        return JSON_LOOKUP_PATHERROR;
      }
    }
    if( (x & 0x0f)!=JSONB_OBJECT ) return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    j = iRoot + n;  /* j is the index of a label */
    iEnd = j+sz;
    while( j<iEnd ){
      int rawLabel;
      const char *zLabel;
      x = pParse->aBlob[j] & 0x0f;
      if( x<JSONB_TEXT || x>JSONB_TEXTRAW ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      k = j+n;  /* k is the index of the label text */
      if( k+sz>=iEnd ) return JSON_LOOKUP_ERROR;
      zLabel = (const char*)&pParse->aBlob[k];
      rawLabel = x==JSONB_TEXT || x==JSONB_TEXTRAW;
      if( jsonLabelCompare(zKey, nKey, rawKey, zLabel, sz, rawLabel) ){
        u32 v = k+sz;  /* v is the index of the value */
        if( ((pParse->aBlob[v])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
        n = jsonbPayloadSize(pParse, v, &sz);
        if( n==0 || v+n+sz>iEnd ) return JSON_LOOKUP_ERROR;
        assert( j>0 );
        rc = jsonLookupStep(pParse, v, &zPath[i], j);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      j = k+sz;
      if( ((pParse->aBlob[j])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( pParse->eEdit>=JEDIT_INS ){
      u32 nIns;          /* Total bytes to insert (label+value) */
      JsonParse v;       /* BLOB encoding of the value to be inserted */
      JsonParse ix;      /* Header of the label to be inserted */
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      memset(&ix, 0, sizeof(ix));
      ix.db = pParse->db;
      jsonBlobAppendNode(&ix, rawKey?JSONB_TEXTRAW:JSONB_TEXT5, nKey, 0);
      pParse->oom |= ix.oom;
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, ix.nBlob+nKey+v.nBlob)
      ){
        assert( !pParse->oom );
        nIns = ix.nBlob + nKey + v.nBlob;
        jsonBlobEdit(pParse, j, 0, 0, nIns);
        if( !pParse->oom ){
          assert( pParse->aBlob!=0 ); /* Because pParse->oom!=0 */
          assert( ix.aBlob!=0 );      /* Because pPasre->oom!=0 */
          memcpy(&pParse->aBlob[j], ix.aBlob, ix.nBlob);
          k = j + ix.nBlob;
          memcpy(&pParse->aBlob[k], zKey, nKey);
          k += nKey;
          memcpy(&pParse->aBlob[k], v.aBlob, v.nBlob);
          if( ALWAYS(pParse->delta) ) jsonAfterEditSizeAdjust(pParse, iRoot);
        }
      }
      jsonParseReset(&v);
      jsonParseReset(&ix);
      return rc;
    }
  }else if( zPath[0]=='[' ){
    x = pParse->aBlob[iRoot] & 0x0f;
    if( x!=JSONB_ARRAY )  return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    k = 0;
    i = 1;
    while( sqlite3Isdigit(zPath[i]) ){
      k = k*10 + zPath[i] - '0';
      i++;
    }
    if( i<2 || zPath[i]!=']' ){
      if( zPath[1]=='#' ){
        k = jsonbArrayCount(pParse, iRoot);
        i = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int nn = 0;
          i = 3;
          do{
            nn = nn*10 + zPath[i] - '0';
            i++;
          }while( sqlite3Isdigit(zPath[i]) );
          if( nn>k ) return JSON_LOOKUP_NOTFOUND;
          k -= nn;
        }
        if( zPath[i]!=']' ){
          return JSON_LOOKUP_PATHERROR;
        }
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
    }
    j = iRoot+n;
    iEnd = j+sz;
    while( j<iEnd ){
      if( k==0 ){
        rc = jsonLookupStep(pParse, j, &zPath[i+1], 0);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      k--;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( k>0 ) return JSON_LOOKUP_NOTFOUND;
    if( pParse->eEdit>=JEDIT_INS ){
      JsonParse v;
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i+1]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, v.nBlob)
      ){
        assert( !pParse->oom );
        jsonBlobEdit(pParse, j, 0, v.aBlob, v.nBlob);
      }
      jsonParseReset(&v);
      if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
      return rc;
    }
  }else{
    return JSON_LOOKUP_PATHERROR;
  }
  return JSON_LOOKUP_NOTFOUND;
}